

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O0

_Bool AArch64_AM_isValidDecodeLogicalImmediate(uint64_t val,uint regSize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int in_ESI;
  ulong in_RDI;
  uint imms;
  uint N;
  int len;
  uint S;
  uint size;
  undefined1 local_1;
  
  uVar1 = (uint)in_RDI & 0x3f;
  if ((in_ESI == 0x20) && ((in_RDI >> 0xc & 1) != 0)) {
    local_1 = false;
  }
  else {
    uVar2 = countLeadingZeros(((uint)(in_RDI >> 0xc) & 1) << 6 | (uVar1 ^ 0xffffffff) & 0x3f);
    if ((int)(0x1f - uVar2) < 0) {
      local_1 = false;
    }
    else {
      iVar3 = 1 << ((byte)(0x1f - uVar2) & 0x1f);
      if ((uVar1 & iVar3 - 1U) == iVar3 - 1U) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

static inline bool AArch64_AM_isValidDecodeLogicalImmediate(uint64_t val, unsigned regSize)
{
	unsigned size;
	unsigned S;
	int len;
	// Extract the N and imms fields needed for checking.
	unsigned N = (val >> 12) & 1;
	unsigned imms = val & 0x3f;

	if (regSize == 32 && N != 0) // undefined logical immediate encoding
		return false;
	len = 31 - countLeadingZeros((N << 6) | (~imms & 0x3f));
	if (len < 0) // undefined logical immediate encoding
		return false;
	size = (1 << len);
	S = imms & (size - 1);
	if (S == size - 1) // undefined logical immediate encoding
		return false;

	return true;
}